

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_private.c
# Opt level: O0

char * ERR_getErrorString(ERR_enum code)

{
  char *pcStack_10;
  ERR_enum code_local;
  
  switch(code) {
  case ZSTD_error_no_error:
    pcStack_10 = "No error detected";
    break;
  case ZSTD_error_GENERIC:
    pcStack_10 = "Error (generic)";
    break;
  case ZSTD_error_prefix_unknown:
    pcStack_10 = "Unknown frame descriptor";
    break;
  case ZSTD_error_version_unsupported:
    pcStack_10 = "Version not supported";
    break;
  case ZSTD_error_frameParameter_unsupported:
    pcStack_10 = "Unsupported frame parameter";
    break;
  case ZSTD_error_frameParameter_windowTooLarge:
    pcStack_10 = "Frame requires too much memory for decoding";
    break;
  case ZSTD_error_corruption_detected:
    pcStack_10 = "Data corruption detected";
    break;
  case ZSTD_error_checksum_wrong:
    pcStack_10 = "Restored data doesn\'t match checksum";
    break;
  case ZSTD_error_literals_headerWrong:
    pcStack_10 = "Header of Literals\' block doesn\'t respect format specification";
    break;
  case ZSTD_error_dictionary_corrupted:
    pcStack_10 = "Dictionary is corrupted";
    break;
  case ZSTD_error_dictionary_wrong:
    pcStack_10 = "Dictionary mismatch";
    break;
  case ZSTD_error_dictionaryCreation_failed:
    pcStack_10 = "Cannot create Dictionary from provided samples";
    break;
  case ZSTD_error_parameter_unsupported:
    pcStack_10 = "Unsupported parameter";
    break;
  case ZSTD_error_parameter_combination_unsupported:
    pcStack_10 = "Unsupported combination of parameters";
    break;
  case ZSTD_error_parameter_outOfBound:
    pcStack_10 = "Parameter is out of bound";
    break;
  case ZSTD_error_tableLog_tooLarge:
    pcStack_10 = "tableLog requires too much memory : unsupported";
    break;
  case ZSTD_error_maxSymbolValue_tooLarge:
    pcStack_10 = "Unsupported max Symbol Value : too large";
    break;
  case ZSTD_error_maxSymbolValue_tooSmall:
    pcStack_10 = "Specified maxSymbolValue is too small";
    break;
  case ZSTD_error_stabilityCondition_notRespected:
    pcStack_10 = "pledged buffer stability condition is not respected";
    break;
  case ZSTD_error_stage_wrong:
    pcStack_10 = "Operation not authorized at current processing stage";
    break;
  case ZSTD_error_init_missing:
    pcStack_10 = "Context should be init first";
    break;
  case ZSTD_error_memory_allocation:
    pcStack_10 = "Allocation error : not enough memory";
    break;
  case ZSTD_error_workSpace_tooSmall:
    pcStack_10 = "workSpace buffer is not large enough";
    break;
  case ZSTD_error_dstSize_tooSmall:
    pcStack_10 = "Destination buffer is too small";
    break;
  case ZSTD_error_srcSize_wrong:
    pcStack_10 = "Src size is incorrect";
    break;
  case ZSTD_error_dstBuffer_null:
    pcStack_10 = "Operation on NULL destination buffer";
    break;
  case ZSTD_error_noForwardProgress_destFull:
    pcStack_10 = "Operation made no progress over multiple calls, due to output buffer being full";
    break;
  case ZSTD_error_noForwardProgress_inputEmpty:
    pcStack_10 = "Operation made no progress over multiple calls, due to input being empty";
    break;
  case ZSTD_error_frameIndex_tooLarge:
    pcStack_10 = "Frame index is too large";
    break;
  case ZSTD_error_seekableIO:
    pcStack_10 = "An I/O error occurred when reading/seeking";
    break;
  case ZSTD_error_dstBuffer_wrong:
    pcStack_10 = "Destination buffer is wrong";
    break;
  case ZSTD_error_srcBuffer_wrong:
    pcStack_10 = "Source buffer is wrong";
    break;
  case ZSTD_error_sequenceProducer_failed:
    pcStack_10 = "Block-level external sequence producer returned an error code";
    break;
  case ZSTD_error_externalSequences_invalid:
    pcStack_10 = "External sequences are not valid";
    break;
  case ZSTD_error_maxCode:
  default:
    pcStack_10 = "Unspecified error code";
  }
  return pcStack_10;
}

Assistant:

const char* ERR_getErrorString(ERR_enum code)
{
#ifdef ZSTD_STRIP_ERROR_STRINGS
    (void)code;
    return "Error strings stripped";
#else
    static const char* const notErrorCode = "Unspecified error code";
    switch( code )
    {
    case PREFIX(no_error): return "No error detected";
    case PREFIX(GENERIC):  return "Error (generic)";
    case PREFIX(prefix_unknown): return "Unknown frame descriptor";
    case PREFIX(version_unsupported): return "Version not supported";
    case PREFIX(frameParameter_unsupported): return "Unsupported frame parameter";
    case PREFIX(frameParameter_windowTooLarge): return "Frame requires too much memory for decoding";
    case PREFIX(corruption_detected): return "Data corruption detected";
    case PREFIX(checksum_wrong): return "Restored data doesn't match checksum";
    case PREFIX(literals_headerWrong): return "Header of Literals' block doesn't respect format specification";
    case PREFIX(parameter_unsupported): return "Unsupported parameter";
    case PREFIX(parameter_combination_unsupported): return "Unsupported combination of parameters";
    case PREFIX(parameter_outOfBound): return "Parameter is out of bound";
    case PREFIX(init_missing): return "Context should be init first";
    case PREFIX(memory_allocation): return "Allocation error : not enough memory";
    case PREFIX(workSpace_tooSmall): return "workSpace buffer is not large enough";
    case PREFIX(stage_wrong): return "Operation not authorized at current processing stage";
    case PREFIX(tableLog_tooLarge): return "tableLog requires too much memory : unsupported";
    case PREFIX(maxSymbolValue_tooLarge): return "Unsupported max Symbol Value : too large";
    case PREFIX(maxSymbolValue_tooSmall): return "Specified maxSymbolValue is too small";
    case PREFIX(stabilityCondition_notRespected): return "pledged buffer stability condition is not respected";
    case PREFIX(dictionary_corrupted): return "Dictionary is corrupted";
    case PREFIX(dictionary_wrong): return "Dictionary mismatch";
    case PREFIX(dictionaryCreation_failed): return "Cannot create Dictionary from provided samples";
    case PREFIX(dstSize_tooSmall): return "Destination buffer is too small";
    case PREFIX(srcSize_wrong): return "Src size is incorrect";
    case PREFIX(dstBuffer_null): return "Operation on NULL destination buffer";
    case PREFIX(noForwardProgress_destFull): return "Operation made no progress over multiple calls, due to output buffer being full";
    case PREFIX(noForwardProgress_inputEmpty): return "Operation made no progress over multiple calls, due to input being empty";
        /* following error codes are not stable and may be removed or changed in a future version */
    case PREFIX(frameIndex_tooLarge): return "Frame index is too large";
    case PREFIX(seekableIO): return "An I/O error occurred when reading/seeking";
    case PREFIX(dstBuffer_wrong): return "Destination buffer is wrong";
    case PREFIX(srcBuffer_wrong): return "Source buffer is wrong";
    case PREFIX(sequenceProducer_failed): return "Block-level external sequence producer returned an error code";
    case PREFIX(externalSequences_invalid): return "External sequences are not valid";
    case PREFIX(maxCode):
    default: return notErrorCode;
    }
#endif
}